

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqllogic_command.cpp
# Opt level: O3

void __thiscall duckdb::LoadCommand::ExecuteInternal(LoadCommand *this,ExecuteContext *context)

{
  pointer pcVar1;
  pointer pDVar2;
  pointer this_00;
  DatabaseInstance *pDVar3;
  DBConfig DVar4;
  unique_ptr<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>,_true> *this_01;
  SQLLogicTestRunner *pSVar5;
  string resolved_path;
  string local_a8;
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  string local_68;
  string local_48;
  
  pSVar5 = (this->super_Command).runner;
  pcVar1 = (this->dbpath)._M_dataplus._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + (this->dbpath)._M_string_length);
  SQLLogicTestRunner::LoopReplacement(&local_a8,pSVar5,&local_48,&context->running_loops);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if (this->readonly == false) {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,local_a8._M_dataplus._M_p,
               local_a8._M_dataplus._M_p + local_a8._M_string_length);
    DeleteDatabase(&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
  }
  std::__cxx11::string::_M_assign((string *)&((this->super_Command).runner)->dbpath);
  this_01 = &((this->super_Command).runner)->config;
  if (this->readonly == true) {
    pDVar2 = unique_ptr<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>,_true>::operator->
                       (this_01);
    pDVar2[0x148] = (DBConfig)0x0;
    pDVar2 = unique_ptr<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>,_true>::operator->
                       (&((this->super_Command).runner)->config);
    DVar4 = (DBConfig)0x2;
  }
  else {
    pDVar2 = unique_ptr<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>,_true>::operator->
                       (this_01);
    pDVar2[0x148] = (DBConfig)0x1;
    pDVar2 = unique_ptr<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>,_true>::operator->
                       (&((this->super_Command).runner)->config);
    DVar4 = (DBConfig)0x1;
  }
  pDVar2[0xd0] = DVar4;
  pSVar5 = (this->super_Command).runner;
  if ((pSVar5->db).super_unique_ptr<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>_>._M_t.
      super___uniq_ptr_impl<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::DuckDB_*,_std::default_delete<duckdb::DuckDB>_>.
      super__Head_base<0UL,_duckdb::DuckDB_*,_false>._M_head_impl != (DuckDB *)0x0) {
    this_00 = unique_ptr<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>,_true>::operator->
                        (&pSVar5->db);
    pDVar3 = shared_ptr<duckdb::DatabaseInstance,_true>::operator->
                       ((shared_ptr<duckdb::DatabaseInstance,_true> *)this_00);
    pDVar2 = unique_ptr<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>,_true>::operator->
                       (&((this->super_Command).runner)->config);
    std::__cxx11::string::_M_assign((string *)(pDVar2 + 0x208));
    *(DatabaseInstance *)(pDVar2 + 0x230) = pDVar3[0x240];
    *(undefined8 *)(pDVar2 + 0x228) = *(undefined8 *)(pDVar3 + 0x238);
    pSVar5 = (this->super_Command).runner;
  }
  local_88[0] = local_78;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_88,local_a8._M_dataplus._M_p,
             local_a8._M_dataplus._M_p + local_a8._M_string_length);
  (**pSVar5->_vptr_SQLLogicTestRunner)(pSVar5,local_88,1);
  if (local_88[0] != local_78) {
    operator_delete(local_88[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  return;
}

Assistant:

void LoadCommand::ExecuteInternal(ExecuteContext &context) const {
	auto resolved_path = runner.LoopReplacement(dbpath, context.running_loops);
	if (!readonly) {
		// delete the target database file, if it exists
		DeleteDatabase(resolved_path);
	}
	runner.dbpath = resolved_path;

	// set up the config file
	if (readonly) {
		runner.config->options.use_temporary_directory = false;
		runner.config->options.access_mode = AccessMode::READ_ONLY;
	} else {
		runner.config->options.use_temporary_directory = true;
		runner.config->options.access_mode = AccessMode::AUTOMATIC;
	}
	if (runner.db) {
		runner.config->options.serialization_compatibility =
		    runner.db->instance->config.options.serialization_compatibility;
	}
	// now create the database file
	runner.LoadDatabase(resolved_path, true);
}